

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O1

void __thiscall optimization::common_expr_del::Node::Node(Node *this)

{
  _Rb_tree_header *p_Var1;
  
  *(undefined4 *)&(this->mainVar).field_0x8 = 0;
  (this->mainVar).field_0x18 = 0;
  (this->operands).
  super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->operands).
  super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->operands).
           super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(this->operands).
           super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
  (this->mainVar).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001effc8;
  (this->mainVar).shift = Lsl;
  (this->mainVar).shift_amount = '\0';
  (this->live_vars).super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->live_vars;
  (this->live_vars).super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->live_vars;
  (this->live_vars).super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  _M_node._M_size = 0;
  (this->local_vars).super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->local_vars;
  (this->local_vars).super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->local_vars;
  (this->local_vars).super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  _M_node._M_size = 0;
  (this->value).super__Optional_base<mir::inst::Value,_false,_false>._M_payload.
  super__Optional_payload_base<mir::inst::Value>._M_engaged = false;
  p_Var1 = &(this->parents)._M_t._M_impl.super__Rb_tree_header;
  (this->parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->parents)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined ***)
   &(this->refVal).
    super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>._M_u =
       &PTR_display_001ee058;
  *(undefined4 *)
   ((long)&(this->refVal).
           super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_> + 8) =
       0xffffffff;
  *(__index_type *)
   ((long)&(this->refVal).
           super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_> + 0x20)
       = '\0';
  this->is_leaf = true;
  return;
}

Assistant:

Node() : is_leaf(true) {}